

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O3

int __thiscall
CVmObjGramProd::getp_addAlt(CVmObjGramProd *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  uint match_obj;
  int iVar1;
  ushort *puVar2;
  vm_val_t *pvVar3;
  CVmDynamicCompiler *this_00;
  uint uVar4;
  vm_val_t *this_01;
  uint uVar5;
  vm_obj_id_t local_78;
  CVmDynCompResults local_68;
  vm_obj_id_t local_50;
  CVmObjGramProd *local_48;
  uint local_40;
  uint local_3c;
  ulong local_38;
  
  if (oargc == (uint *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = *oargc;
  }
  if (getp_addAlt(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_addAlt();
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,oargc,&getp_addAlt::desc);
  if (iVar1 != 0) {
    return 1;
  }
  this_01 = sp_ + -1;
  puVar2 = (ushort *)vm_val_t::get_as_string(this_01);
  if (puVar2 == (ushort *)0x0) {
    err_throw(0x7e3);
  }
  if (sp_[-2].typ == VM_OBJ) {
    local_38 = (ulong)*puVar2;
    match_obj = sp_[-2].val.obj;
    iVar1 = (**(code **)(*(long *)&G_obj_table_X.pages_[match_obj >> 0xc][match_obj & 0xfff].ptr_ +
                        8))();
    if (iVar1 != 0) {
      uVar4 = 0;
      if (uVar5 < 3) {
        local_78 = 0;
        pvVar3 = sp_;
      }
      else {
        local_78 = 0;
        if (sp_[-3].typ == VM_NIL) {
          uVar4 = 0;
        }
        else {
          if (sp_[-3].typ != VM_OBJ) {
LAB_0025ee48:
            err_throw(0x7e6);
          }
          uVar4 = sp_[-3].val.obj;
          iVar1 = (**(code **)(*(long *)&G_obj_table_X.pages_[uVar4 >> 0xc][uVar4 & 0xfff].ptr_ + 8)
                  )();
          if (iVar1 == 0) goto LAB_0025ee48;
        }
        pvVar3 = sp_;
        if ((uVar5 != 3) && (sp_[-4].typ != VM_NIL)) {
          if (sp_[-4].typ != VM_OBJ) {
            err_throw(0x7da);
          }
          local_78 = sp_[-4].val.obj;
        }
      }
      sp_ = pvVar3 + 1;
      pvVar3->typ = VM_OBJ;
      (pvVar3->val).obj = self;
      local_68.err = 0;
      local_68.msgbuf = (char *)0x0;
      local_68._vptr_CVmDynCompResults = (_func_int **)&PTR__CVmDynCompResults_00322760;
      local_50 = self;
      local_48 = this;
      local_40 = uVar4;
      local_3c = match_obj;
      this_00 = CVmDynamicCompiler::get();
      CVmDynamicCompiler::compile
                (this_00,0,local_78,0,0,this_01,(char *)(puVar2 + 1),local_38,DCModeGramAlt,
                 (CVmDynCompDebug *)0x0,&local_68);
      if (local_68.err != 0) {
        CVmDynCompResults::throw_error(&local_68);
      }
      build_alt_props(this,match_obj);
      sp_ = sp_ + -(long)(int)(uVar5 + 1);
      retval->typ = VM_OBJ;
      (retval->val).obj = self;
      local_68._vptr_CVmDynCompResults = (_func_int **)&PTR__CVmDynCompResults_003201d0;
      if (local_68.msgbuf == (char *)0x0) {
        return 1;
      }
      free(local_68.msgbuf);
      return 1;
    }
  }
  err_throw(0x900);
}

Assistant:

int CVmObjGramProd::getp_addAlt(VMG_ vm_obj_id_t self,
                                vm_val_t *retval, uint *oargc)
{
    const vm_val_t *v;
    
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(2, 2);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* the first argument is the rule list */
    const vm_val_t *alt = G_stk->get(0);
    const char *altp = alt->get_as_string(vmg0_);
    if (altp == 0)
        err_throw(VMERR_STRING_VAL_REQD);

    /* get the source length and buffer pointer */
    size_t altlen = vmb_get_len(altp);
    altp += VMB_LEN;

    /* the next argument is the match object class */
    vm_obj_id_t match = VM_INVALID_OBJ;
    v = G_stk->get(1);
    if (v->typ != VM_OBJ
        || !CVmObjTads::is_tadsobj_obj(vmg_ match = v->val.obj))
        err_throw(VMERR_BAD_TYPE_BIF);

    /* next comes the optional dictionary argument */
    vm_obj_id_t dict = VM_INVALID_OBJ;
    if (argc >= 3
        && (v = G_stk->get(2))->typ != VM_NIL
        && (v->typ != VM_OBJ
            || !CVmObjDict::is_dictionary_obj(vmg_ (dict = v->val.obj))))
        err_throw(VMERR_INVAL_OBJ_TYPE);

    /* next comes the optional symbol table */
    vm_obj_id_t symtab = VM_INVALID_OBJ;
    if (argc >= 4 && (v = G_stk->get(3))->typ != VM_NIL)
    {
        /* get the value, and make sure it's an object */
        symtab = v->val.obj;
        if (v->typ != VM_OBJ)
            err_throw(VMERR_OBJ_VAL_REQD);
    }

    /* push self for gc protection */
    G_interpreter->push_obj(vmg_ self);

    /* dynamically compile the alt list */
    CVmGramCompResults results(self, this, dict, match);
    CVmDynamicCompiler *comp = CVmDynamicCompiler::get(vmg0_);
    comp->compile(vmg_ FALSE, symtab, VM_INVALID_OBJ, VM_INVALID_OBJ,
                  alt, altp, altlen, DCModeGramAlt, 0, &results);

    /* check for errors */
    if (results.err != 0)
        results.throw_error(vmg0_);

    /* rebuild the grammarAltProps property for the match object */
    build_alt_props(vmg_ match);

    /* discard arguments and gc protection */
    G_stk->discard(argc + 1);

    /* return self */
    retval->set_obj(self);

    /* handled */
    return TRUE;
}